

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmpp_obj.c
# Opt level: O2

rk_s32 kmpp_obj_get_by_sptr(KmppObj *obj,KmppShmPtr *sptr,char *caller)

{
  KmppObjs *pKVar1;
  undefined8 *puVar2;
  char *fmt;
  ulong uVar3;
  char *name;
  void *pvVar4;
  KmppObjDefImpl *def;
  
  pKVar1 = objs;
  if ((objs == (KmppObjs *)0x0) && (((byte)kmpp_obj_debug & 1) != 0)) {
    _mpp_log_l(4,"kmpp_obj","kmpp objs srv not init at %s\n",(char *)0x0,caller);
  }
  if (sptr == (KmppShmPtr *)0x0) {
    pvVar4 = (void *)0x0;
  }
  else {
    pvVar4 = (sptr->field_0).uptr;
  }
  if ((obj == (KmppObj *)0x0 || sptr == (KmppShmPtr *)0x0) || pvVar4 == (void *)0x0) {
    _mpp_log_l(2,"kmpp_obj","invalid param obj %p sptr %p uptr %p at %s\n","kmpp_obj_get_by_sptr",
               obj,sptr,pvVar4,caller);
  }
  else {
    *obj = (KmppObj)0x0;
    if (pKVar1 != (KmppObjs *)0x0) {
      uVar3 = (ulong)*(uint *)((long)pvVar4 + (long)pKVar1->name_offset);
      if (uVar3 == 0) {
        _mpp_log_l(2,"kmpp_obj","invalid obj name offset %d at %s\n","kmpp_obj_get_by_sptr",0,caller
                  );
      }
      else {
        name = (char *)(uVar3 + (long)pKVar1->root);
        kmpp_objdef_get(&def,name);
        if (def == (KmppObjDefImpl *)0x0) {
          fmt = "failed to get objdef %p - %s at %s\n";
          caller = name;
        }
        else {
          puVar2 = (undefined8 *)mpp_osal_calloc("kmpp_obj_get_by_sptr",0x30);
          if (puVar2 != (undefined8 *)0x0) {
            *puVar2 = def->name;
            puVar2[1] = def;
            puVar2[2] = def->trie;
            *(undefined4 *)(puVar2 + 3) = 1;
            puVar2[4] = pvVar4;
            puVar2[5] = (long)pKVar1->entry_offset + (long)pvVar4;
            if (((byte)kmpp_obj_debug & 1) != 0) {
              _mpp_log_l(4,"kmpp_obj","get obj %s - %p by sptr [u:k] %llx:%llx at %s\n",(char *)0x0,
                         def->name,puVar2,(sptr->field_0).uaddr,(sptr->field_1).kaddr,caller);
            }
            *(undefined8 **)((long)(sptr->field_0).uptr + (long)pKVar1->priv_offset) = puVar2;
            *obj = puVar2;
            return 0;
          }
          fmt = "malloc obj impl %d failed at %s\n";
          name = (char *)0x30;
        }
        _mpp_log_l(2,"kmpp_obj",fmt,"kmpp_obj_get_by_sptr",name,caller);
      }
    }
  }
  return -1;
}

Assistant:

rk_s32 kmpp_obj_get_by_sptr(KmppObj *obj, KmppShmPtr *sptr, const char *caller)
{
    KmppObjs *p = get_objs(caller);
    KmppObjImpl *impl;
    KmppObjDefImpl *def;
    rk_u8 *uptr = sptr ? sptr->uptr : NULL;
    rk_s32 ret = rk_nok;

    if (!obj || !sptr || !uptr) {
        mpp_loge_f("invalid param obj %p sptr %p uptr %p at %s\n",
                   obj, sptr, uptr, caller);
        return ret;
    }

    *obj = NULL;

    if (!p)
        return ret;

    {
        rk_u32 val = *((rk_u32 *)(uptr + p->name_offset));
        char *str;

        if (!val) {
            mpp_loge_f("invalid obj name offset %d at %s\n", val, caller);
            return ret;
        }

        str = (char *)p->root + val;
        kmpp_objdef_get((KmppObjDef *)&def, str);
        if (!def) {
            mpp_loge_f("failed to get objdef %p - %s at %s\n", str, str, caller);
            return ret;
        }
    }

    impl = mpp_calloc(KmppObjImpl, 1);
    if (!impl) {
        mpp_loge_f("malloc obj impl %d failed at %s\n", sizeof(KmppObjImpl), caller);
        return ret;
    }

    impl->name = def->name;
    impl->def = def;
    impl->trie = def->trie;
    impl->need_free = 1;
    impl->shm = (KmppShmPtr *)uptr;
    impl->entry = uptr + p->entry_offset;

    obj_dbg_flow("get obj %s - %p by sptr [u:k] %llx:%llx at %s\n", def->name,
                 impl, sptr->uaddr, sptr->kaddr, caller);

    /* write userspace object address to share memory userspace private value */
    *(RK_U64 *)U64_TO_PTR(sptr->uaddr + p->priv_offset) = (RK_U64)(intptr_t)impl;

    *obj = impl;

    return rk_ok;
}